

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O2

void ApprovalTests::SystemUtils::ensureParentDirectoryExists(string *fullFilePath)

{
  string parentDirectory;
  string sStack_28;
  
  FileUtils::getDirectory(&sStack_28,fullFilePath);
  if (sStack_28._M_string_length != 0) {
    ensureDirectoryExists(&sStack_28);
  }
  ::std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void SystemUtils::ensureParentDirectoryExists(const std::string& fullFilePath)
    {
        const std::string parentDirectory = FileUtils::getDirectory(fullFilePath);
        if (!parentDirectory.empty())
        {
            SystemUtils::ensureDirectoryExists(parentDirectory);
        }
    }